

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_print_backtrace(void)

{
  uint uVar1;
  int wstatus;
  int pid;
  char attach [32];
  char *GGML_NO_BACKTRACE;
  uint local_40;
  __pid_t local_3c;
  char local_38 [32];
  char *local_18;
  
  local_18 = getenv("GGML_NO_BACKTRACE");
  if (local_18 == (char *)0x0) {
    uVar1 = getpid();
    snprintf(local_38,0x20,"attach %d",(ulong)uVar1);
    local_3c = fork();
    if (local_3c == 0) {
      execlp("gdb","gdb","--batch","-ex","set style enabled on","-ex",local_38,"-ex",
             "bt -frame-info source-and-location","-ex","detach","-ex","quit",0);
      execlp("lldb","lldb","--batch","-o","bt","-o","quit","-p",local_38,0);
      exit(1);
    }
    waitpid(local_3c,(int *)&local_40,0);
    if (((local_40 & 0x7f) == 0) && ((int)(local_40 & 0xff00) >> 8 == 1)) {
      ggml_print_backtrace_symbols();
    }
  }
  return;
}

Assistant:

static void ggml_print_backtrace(void) {
    const char * GGML_NO_BACKTRACE = getenv("GGML_NO_BACKTRACE");
    if (GGML_NO_BACKTRACE) {
        return;
    }
    char attach[32];
    snprintf(attach, sizeof(attach), "attach %d", getpid());
    int pid = fork();
    if (pid == 0) {
        // try gdb
        execlp("gdb", "gdb", "--batch",
            "-ex", "set style enabled on",
            "-ex", attach,
            "-ex", "bt -frame-info source-and-location",
            "-ex", "detach",
            "-ex", "quit",
            (char *) NULL);
        // try lldb
        execlp("lldb", "lldb", "--batch",
            "-o", "bt",
            "-o", "quit",
            "-p", attach,
            (char *) NULL);
        exit(EXIT_FAILURE);
    } else {
        int wstatus;
        waitpid(pid, &wstatus, 0);
        if (WIFEXITED(wstatus)) {
            if (WEXITSTATUS(wstatus) == EXIT_FAILURE) {
                // gdb failed, fallback to backtrace_symbols
                ggml_print_backtrace_symbols();
            }
        }
    }
}